

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode AcceptServerConnect(Curl_easy *data)

{
  undefined1 *puVar1;
  connectdata *conn;
  curl_trc_feat *pcVar2;
  int iVar3;
  int iVar4;
  CURLcode CVar5;
  curl_socklen_t size;
  Curl_sockaddr_storage add;
  int local_a0 [2];
  sockaddr local_98 [8];
  
  conn = data->conn;
  iVar4 = conn->sock[1];
  local_a0[1] = 0x80;
  iVar3 = getsockname(iVar4,local_98,(socklen_t *)(local_a0 + 1));
  if (iVar3 == 0) {
    local_a0[1] = 0x80;
    iVar4 = accept(iVar4,local_98,(socklen_t *)(local_a0 + 1));
    local_a0[0] = iVar4;
    if (iVar4 != -1) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"Connection accepted from server");
      }
      puVar1 = &(conn->bits).field_0x1;
      *puVar1 = *puVar1 & 0xef;
      curlx_nonblock(iVar4,1);
      CVar5 = Curl_conn_tcp_accepted_set(data,conn,1,local_a0);
      if (CVar5 != CURLE_OK) {
        close(local_a0[0]);
        return CVar5;
      }
      if ((data->set).fsockopt == (curl_sockopt_callback)0x0) {
        return CURLE_OK;
      }
      Curl_set_in_callback(data,true);
      iVar4 = (*(data->set).fsockopt)((data->set).sockopt_client,local_a0[0],CURLSOCKTYPE_ACCEPT);
      Curl_set_in_callback(data,false);
      if (iVar4 == 0) {
        return CURLE_OK;
      }
      close_secondarysocket(data);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  Curl_failf(data,"Error accept()ing server connect");
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode AcceptServerConnect(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  curl_socket_t sock = conn->sock[SECONDARYSOCKET];
  curl_socket_t s = CURL_SOCKET_BAD;
#ifdef USE_IPV6
  struct Curl_sockaddr_storage add;
#else
  struct sockaddr_in add;
#endif
  curl_socklen_t size = (curl_socklen_t) sizeof(add);
  CURLcode result;

  if(0 == getsockname(sock, (struct sockaddr *) &add, &size)) {
    size = sizeof(add);

    s = accept(sock, (struct sockaddr *) &add, &size);
  }

  if(CURL_SOCKET_BAD == s) {
    failf(data, "Error accept()ing server connect");
    return CURLE_FTP_PORT_FAILED;
  }
  infof(data, "Connection accepted from server");
  /* when this happens within the DO state it is important that we mark us as
     not needing DO_MORE anymore */
  conn->bits.do_more = FALSE;

  (void)curlx_nonblock(s, TRUE); /* enable non-blocking */
  /* Replace any filter on SECONDARY with one listening on this socket */
  result = Curl_conn_tcp_accepted_set(data, conn, SECONDARYSOCKET, &s);
  if(result) {
    sclose(s);
    return result;
  }

  if(data->set.fsockopt) {
    int error = 0;

    /* activate callback for setting socket options */
    Curl_set_in_callback(data, TRUE);
    error = data->set.fsockopt(data->set.sockopt_client,
                               s,
                               CURLSOCKTYPE_ACCEPT);
    Curl_set_in_callback(data, FALSE);

    if(error) {
      close_secondarysocket(data);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  return CURLE_OK;

}